

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef.c
# Opt level: O2

void av1_cdef_frame(YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,MACROBLOCKD *xd,
                   cdef_init_fb_row_t cdef_init_fb_row_fn)

{
  ulong uVar1;
  ulong uVar2;
  uint plane_end;
  int fbr;
  ulong uVar3;
  aom_internal_error_info *error_info;
  
  plane_end = (uint)(cm->seq_params->monochrome == '\0') * 2 + 1;
  error_info = (aom_internal_error_info *)(ulong)plane_end;
  uVar1 = (long)((cm->mi_params).mi_rows + 0xf) / 0x10;
  uVar3 = 0;
  av1_setup_dst_planes(xd->plane,cm->seq_params->sb_size,frame,0,0,0,plane_end);
  uVar2 = uVar1 & 0xffffffff;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  while (fbr = (int)uVar3, (int)uVar2 != fbr) {
    av1_cdef_fb_row(cm,xd,(cm->cdef_info).linebuf,(cm->cdef_info).colbuf,(cm->cdef_info).srcbuf,fbr,
                    cdef_init_fb_row_fn,(AV1CdefSyncData *)0x0,error_info);
    uVar3 = (ulong)(fbr + 1);
  }
  return;
}

Assistant:

void av1_cdef_frame(YV12_BUFFER_CONFIG *frame, AV1_COMMON *const cm,
                    MACROBLOCKD *xd, cdef_init_fb_row_t cdef_init_fb_row_fn) {
  const int num_planes = av1_num_planes(cm);
  const int nvfb = (cm->mi_params.mi_rows + MI_SIZE_64X64 - 1) / MI_SIZE_64X64;

  av1_setup_dst_planes(xd->plane, cm->seq_params->sb_size, frame, 0, 0, 0,
                       num_planes);

  for (int fbr = 0; fbr < nvfb; fbr++)
    av1_cdef_fb_row(cm, xd, cm->cdef_info.linebuf, cm->cdef_info.colbuf,
                    cm->cdef_info.srcbuf, fbr, cdef_init_fb_row_fn, NULL,
                    xd->error_info);
}